

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalFederateId.hpp
# Opt level: O3

iterator __thiscall
std::
_Hashtable<helics::InterfaceHandle,_std::pair<const_helics::InterfaceHandle,_unsigned_long>,_std::allocator<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<helics::InterfaceHandle>,_std::hash<helics::InterfaceHandle>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
::find(_Hashtable<helics::InterfaceHandle,_std::pair<const_helics::InterfaceHandle,_unsigned_long>,_std::allocator<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<helics::InterfaceHandle>,_std::hash<helics::InterfaceHandle>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
       *this,key_type *__k)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  _Node_iterator_base<std::pair<const_helics::InterfaceHandle,_unsigned_long>,_false> _Var4;
  
  iVar1 = __k->hid;
  _Var4._M_cur = (__node_type *)0x0;
  uVar3 = (ulong)(long)iVar1 % this->_M_bucket_count;
  if ((this->_M_buckets[uVar3] != (__node_base_ptr)0x0) &&
     (_Var4._M_cur = (__node_type *)this->_M_buckets[uVar3]->_M_nxt,
     iVar1 != *(int *)&((_Var4._M_cur)->
                       super__Hash_node_value<std::pair<const_helics::InterfaceHandle,_unsigned_long>,_false>
                       ).
                       super__Hash_node_value_base<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>
                       ._M_storage._M_storage)) {
    while (_Var4._M_cur = (__node_type *)((_Var4._M_cur)->super__Hash_node_base)._M_nxt,
          _Var4._M_cur != (__node_type *)0x0) {
      iVar2 = *(int *)&((_Var4._M_cur)->
                       super__Hash_node_value<std::pair<const_helics::InterfaceHandle,_unsigned_long>,_false>
                       ).
                       super__Hash_node_value_base<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>
                       ._M_storage._M_storage;
      if ((ulong)(long)iVar2 % this->_M_bucket_count != uVar3) {
        return (iterator)(__node_type *)0x0;
      }
      if (iVar1 == iVar2) {
        return (iterator)
               (_Node_iterator_base<std::pair<const_helics::InterfaceHandle,_unsigned_long>,_false>)
               _Var4._M_cur;
      }
    }
    _Var4._M_cur = (__node_type *)0x0;
  }
  return (iterator)
         (_Node_iterator_base<std::pair<const_helics::InterfaceHandle,_unsigned_long>,_false>)
         _Var4._M_cur;
}

Assistant:

constexpr BaseType baseValue() const { return hid; }